

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  Index *pIdx;
  Vdbe *p;
  int regPrior;
  Index *pIVar1;
  Index *pPrior;
  Index **ppIVar2;
  int *piVar3;
  int iPartIdxLabel;
  Parse *local_48;
  Index *local_40;
  Vdbe *local_38;
  
  local_38 = pParse->pVdbe;
  local_48 = pParse;
  if ((pTab->tabFlags & 0x80) == 0) {
    pIVar1 = (Index *)0x0;
  }
  else {
    pIVar1 = sqlite3PrimaryKeyIndex(pTab);
  }
  p = local_38;
  ppIVar2 = &pTab->pIndex;
  regPrior = -1;
  pPrior = (Index *)0x0;
  piVar3 = aRegIdx;
  local_40 = pIVar1;
  do {
    pIdx = *ppIVar2;
    if (pIdx == (Index *)0x0) {
      return;
    }
    if (aRegIdx == (int *)0x0) {
      if (pIdx != pIVar1) goto LAB_0017ea7d;
    }
    else if (pIdx != pIVar1 && *piVar3 != 0) {
LAB_0017ea7d:
      if (iIdxNoSeek != iIdxCur) {
        regPrior = sqlite3GenerateIndexKey
                             (local_48,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
        sqlite3VdbeAddOp3(p,0x8c,iIdxCur,regPrior,
                          (uint)(&pIdx->nKeyCol)[(*(ushort *)&pIdx->field_0x63 & 8) == 0]);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 1;
        }
        sqlite3ResolvePartIdxLabel(local_48,iPartIdxLabel);
        pIVar1 = local_40;
        pPrior = pIdx;
      }
    }
    ppIVar2 = &pIdx->pNext;
    iIdxCur = iIdxCur + 1;
    piVar3 = piVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3VdbeChangeP5(v, 1);  /* Cause IdxDelete to error if no entry found */
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}